

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall IRBuilder::ConsumeBranchIsland(IRBuilder *this)

{
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  undefined4 *puVar4;
  LayoutSize local_18;
  uint uStack_14;
  OpCode opcode;
  LayoutSize layoutSize;
  uint32 offset;
  IRBuilder *this_local;
  
  _layoutSize = this;
  do {
    uStack_14 = Js::ByteCodeReader::GetCurrentOffset(&this->m_jnReader);
    OVar3 = Js::ByteCodeReader::ReadOp(&this->m_jnReader,&local_18);
    if (OVar3 != BrLong) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x1c4b,"(opcode == Js::OpCode::BrLong)","opcode == Js::OpCode::BrLong");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    if (local_18 != SmallLayout) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x1c4c,"(layoutSize == Js::SmallLayout)","layoutSize == Js::SmallLayout");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    BuildBrLong(this,BrLong,uStack_14);
    OVar3 = Js::ByteCodeReader::PeekOp(&this->m_jnReader);
  } while (OVar3 == BrLong);
  return;
}

Assistant:

void
IRBuilder::ConsumeBranchIsland()
{
    do
    {
        uint32 offset = m_jnReader.GetCurrentOffset();
        Js::LayoutSize layoutSize;
        Js::OpCode opcode = m_jnReader.ReadOp(layoutSize);
        Assert(opcode == Js::OpCode::BrLong);
        Assert(layoutSize == Js::SmallLayout);
        BuildBrLong(Js::OpCode::BrLong, offset);
    }
    while (m_jnReader.PeekOp() == Js::OpCode::BrLong);
}